

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

Time __thiscall
helics::CommonCore::timeRequest(CommonCore *this,LocalFederateId federateID,Time next)

{
  int iVar1;
  pointer pcVar2;
  size_type sVar3;
  FederateStates FVar4;
  FederateState *this_00;
  InvalidFunctionCall *this_01;
  RegistrationFailure *this_02;
  char *pcVar5;
  pointer_____offset_0x10___ *ppuVar6;
  Time TVar7;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  iteration_time iVar8;
  size_t sStack_f0;
  ActionMessage terminate;
  
  this_00 = getFederateAt(this,federateID);
  if (this_00 == (FederateState *)0x0) {
    this_01 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    message._M_str = "federateID not valid timeRequest";
    message._M_len = 0x20;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)this_01,message);
    ppuVar6 = &InvalidIdentifier::typeinfo;
  }
  else {
    if (this_00->mCallbackBased == true) {
      this_01 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
      pcVar5 = "Time request operation is not permitted for callback based federates";
      sStack_f0 = 0x44;
    }
    else {
      if ((ushort)((this->super_BrokerBase).brokerState._M_i + CONNECTED) < 5) {
        ActionMessage::ActionMessage(&terminate,cmd_stop);
        terminate.dest_id.gid = (this_00->global_id)._M_i.gid;
        terminate.source_id.gid = (this_00->global_id)._M_i.gid;
        FederateState::addAction(this_00,&terminate);
        ActionMessage::~ActionMessage(&terminate);
      }
      FVar4 = FederateState::getState(this_00);
      if (FVar4 == FINISHED) {
        return (Time)0x7fffffffffffffff;
      }
      if (FVar4 == EXECUTING) {
        ActionMessage::ActionMessage(&terminate,cmd_time_request);
        terminate.source_id.gid = (this_00->global_id)._M_i.gid;
        terminate.dest_id.gid = (this_00->global_id)._M_i.gid;
        terminate.flags._0_1_ = (byte)terminate.flags | 0x20;
        terminate.actionTime.internalTimeCode = next.internalTimeCode;
        BrokerBase::addActionMessage(&this->super_BrokerBase,&terminate);
        iVar8 = FederateState::requestTime(this_00,next,NO_ITERATIONS,false);
        TVar7.internalTimeCode = 0x7fffffffffffffff;
        if ((iVar8.state != HALTED) &&
           (TVar7.internalTimeCode = iVar8.grantedTime.internalTimeCode.internalTimeCode,
           iVar8.state == ERROR_RESULT)) {
          iVar1 = this_00->errorCode;
          this_02 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
          pcVar2 = (this_00->errorString)._M_dataplus._M_p;
          sVar3 = (this_00->errorString)._M_string_length;
          if (iVar1 == -1) {
            message_01._M_str = pcVar2;
            message_01._M_len = sVar3;
            RegistrationFailure::RegistrationFailure(this_02,message_01);
            ppuVar6 = &RegistrationFailure::typeinfo;
          }
          else {
            message_02._M_str = pcVar2;
            message_02._M_len = sVar3;
            FunctionExecutionFailure::FunctionExecutionFailure
                      ((FunctionExecutionFailure *)this_02,message_02);
            ppuVar6 = &FunctionExecutionFailure::typeinfo;
          }
          __cxa_throw(this_02,ppuVar6,HelicsException::~HelicsException);
        }
        ActionMessage::~ActionMessage(&terminate);
        return (Time)TVar7.internalTimeCode;
      }
      this_01 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
      pcVar5 = "time request should only be called in execution state";
      sStack_f0 = 0x35;
    }
    message_00._M_str = pcVar5;
    message_00._M_len = sStack_f0;
    InvalidFunctionCall::InvalidFunctionCall(this_01,message_00);
    ppuVar6 = &InvalidFunctionCall::typeinfo;
  }
  __cxa_throw(this_01,ppuVar6,HelicsException::~HelicsException);
}

Assistant:

Time CommonCore::timeRequest(LocalFederateId federateID, Time next)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid timeRequest"));
    }
    if (fed->isCallbackFederate()) {
        throw(InvalidFunctionCall(
            "Time request operation is not permitted for callback based federates"));
    }
    auto cBrokerState = getBrokerState();
    switch (cBrokerState) {
        case BrokerState::TERMINATING:
        case BrokerState::TERMINATED:
        case BrokerState::TERMINATING_ERROR:
        case BrokerState::CONNECTED_ERROR:
        case BrokerState::ERRORED: {
            ActionMessage terminate(CMD_STOP);
            terminate.dest_id = fed->global_id;
            terminate.source_id = fed->global_id;
            fed->addAction(terminate);
        } break;
        default:
            break;
    }
    switch (fed->getState()) {
        case FederateStates::EXECUTING: {
            // generate the request through the core
            ActionMessage treq(CMD_TIME_REQUEST);
            treq.source_id = fed->global_id.load();
            treq.dest_id = fed->global_id.load();
            treq.actionTime = next;
            setActionFlag(treq, indicator_flag);
            addActionMessage(treq);
            auto ret = fed->requestTime(next, IterationRequest::NO_ITERATIONS, false);

            switch (ret.state) {
                case IterationResult::ERROR_RESULT:
                    switch (fed->lastErrorCode()) {
                        case HELICS_ERROR_REGISTRATION_FAILURE:
                            throw(RegistrationFailure(fed->lastErrorString()));
                        default:
                            throw(FunctionExecutionFailure(fed->lastErrorString()));
                    }

                case IterationResult::HALTED:
                    return Time::maxVal();
                default:
                    return ret.grantedTime;
            }
        }
        case FederateStates::FINISHED:
            return Time::maxVal();
        default:
            throw(InvalidFunctionCall("time request should only be called in execution state"));
    }
}